

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::ModportSubroutinePortListSyntax::ModportSubroutinePortListSyntax
          (ModportSubroutinePortListSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token importExport,
          SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *ports)

{
  bool bVar1;
  ModportPortSyntax *pMVar2;
  undefined8 uVar3;
  ModportPortSyntax *child;
  iterator __end2;
  iterator __begin2;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *__range2;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> *ports_local;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes_local;
  ModportSubroutinePortListSyntax *this_local;
  Token importExport_local;
  
  uVar3 = importExport._0_8_;
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,ModportSubroutinePortList,attributes);
  (this->importExport).kind = (short)uVar3;
  (this->importExport).field_0x2 = (char)((ulong)uVar3 >> 0x10);
  (this->importExport).numFlags = (NumericTokenFlags)(char)((ulong)uVar3 >> 0x18);
  (this->importExport).rawLen = (int)((ulong)uVar3 >> 0x20);
  (this->importExport).info = importExport.info;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::SeparatedSyntaxList(&this->ports,ports);
  (this->ports).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  join_0x00000010_0x00000000_ =
       SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::begin(&this->ports);
  _child = SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::end(&this->ports);
  while( true ) {
    bVar1 = iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportPortSyntax_*,_unsigned_long,_slang::syntax::ModportPortSyntax_**,_slang::syntax::ModportPortSyntax_*&>
            ::operator!=((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportPortSyntax_*,_unsigned_long,_slang::syntax::ModportPortSyntax_**,_slang::syntax::ModportPortSyntax_*&>
                          *)&__end2.index,
                         (iterator_base<slang::syntax::ModportPortSyntax_*> *)&child);
    if (!bVar1) break;
    pMVar2 = SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::
             iterator_base<slang::syntax::ModportPortSyntax_*>::operator*
                       ((iterator_base<slang::syntax::ModportPortSyntax_*> *)&__end2.index);
    (pMVar2->super_SyntaxNode).parent = (SyntaxNode *)this;
    iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportPortSyntax_*,_unsigned_long,_slang::syntax::ModportPortSyntax_**,_slang::syntax::ModportPortSyntax_*&>
    ::operator++((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::ModportPortSyntax>::iterator_base<slang::syntax::ModportPortSyntax_*>,_std::random_access_iterator_tag,_slang::syntax::ModportPortSyntax_*,_unsigned_long,_slang::syntax::ModportPortSyntax_**,_slang::syntax::ModportPortSyntax_*&>
                  *)&__end2.index);
  }
  return;
}

Assistant:

ModportSubroutinePortListSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, Token importExport, const SeparatedSyntaxList<ModportPortSyntax>& ports) :
        MemberSyntax(SyntaxKind::ModportSubroutinePortList, attributes), importExport(importExport), ports(ports) {
        this->ports.parent = this;
        for (auto child : this->ports)
            child->parent = this;
    }